

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test::testBody
          (TEST_MockExpectedCall_callWithDoubleParameterAndTolerance_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  double dVar5;
  SimpleString paramName;
  SimpleString local_78;
  MockNamedValue local_68;
  
  SimpleString::SimpleString(&local_78,"paramName");
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x12])
            (0x3ff3333333333333,0x3fc999999999999a,pMVar1,&local_78);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_68,pMVar1,&local_78);
  pcVar3 = SimpleString::asCharString((SimpleString *)&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,"double",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x115,pTVar4);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_68,pMVar1,&local_78);
  dVar5 = MockNamedValue::getDoubleValue(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x15])
            (0x3ff3333333333333,dVar5,0,pUVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x116,pTVar4);
  MockNamedValue::~MockNamedValue(&local_68);
  pUVar2 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_68,pMVar1,&local_78);
  dVar5 = MockNamedValue::getDoubleTolerance(&local_68);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x15])
            (0x3fc999999999999a,dVar5,0,pUVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x117,pTVar4);
  MockNamedValue::~MockNamedValue(&local_68);
  pUVar2 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_68);
  pcVar3 = SimpleString::asCharString((SimpleString *)&local_68);
  (*pUVar2->_vptr_UtestShell[0xc])
            (pUVar2,"funcName -> double paramName: <1.2>",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x118);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  SimpleString::~SimpleString(&local_78);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithDoubleParameterAndTolerance)
{
    const SimpleString paramName = "paramName";
    double value = 1.2;
    double tolerance = 0.2;
    call->withParameter(paramName, value, tolerance);
    STRCMP_EQUAL("double", call->getInputParameterType(paramName).asCharString());
    DOUBLES_EQUAL(value, call->getInputParameter(paramName).getDoubleValue(), 0.0);
    DOUBLES_EQUAL(tolerance, call->getInputParameter(paramName).getDoubleTolerance(), 0.0);
    STRCMP_CONTAINS("funcName -> double paramName: <1.2>", call->callToString().asCharString());
}